

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_writer.cpp
# Opt level: O0

void __thiscall VM_Writer::write_call(VM_Writer *this,string *name,int n_args)

{
  ostream *poVar1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  string *psStack_18;
  int n_args_local;
  string *name_local;
  VM_Writer *this_local;
  
  poVar1 = (ostream *)this->out_file;
  local_1c = n_args;
  psStack_18 = name;
  name_local = (string *)this;
  std::operator+(&local_80,"call ",name);
  std::operator+(&local_60,&local_80," ");
  std::__cxx11::to_string(&local_b0,local_1c);
  std::operator+(&local_40,&local_60,&local_b0);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void VM_Writer::write_call(const std::string &name, int n_args) {
    out_file << "call " + name +  " " + std::to_string(n_args)  << std::endl;
}